

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::setFocusItemHelper
          (QGraphicsScenePrivate *this,QGraphicsItem *item,FocusReason focusReason,
          bool emitFocusChanged)

{
  QGraphicsScene *this_00;
  bool bVar1;
  GraphicsItemFlags GVar2;
  QGraphicsScene *pQVar3;
  QGraphicsItem *_t1;
  long in_FS_OFFSET;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->focusItem != item) {
    this_00 = *(QGraphicsScene **)&this->field_0x8;
    if (item == (QGraphicsItem *)0x0) {
LAB_0059442a:
      _t1 = this->focusItem;
      bVar1 = true;
      item = (QGraphicsItem *)0x0;
    }
    else {
      GVar2 = QGraphicsItem::flags(item);
      if (((uint)GVar2.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                 super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 4) == 0)
      goto LAB_0059442a;
      bVar1 = QGraphicsItem::isVisible(item);
      if (!bVar1) goto LAB_0059442a;
      bVar1 = QGraphicsItem::isEnabled(item);
      if (!bVar1) goto LAB_0059442a;
      QGraphicsScene::setFocus(this_00,focusReason);
      _t1 = this->focusItem;
      if (_t1 == item) {
        if (emitFocusChanged) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            QGraphicsScene::focusItemChanged(this_00,_t1,(QGraphicsItem *)0x0,focusReason);
            return;
          }
          goto LAB_005945bb;
        }
        goto LAB_00594500;
      }
      bVar1 = false;
    }
    if (_t1 != (QGraphicsItem *)0x0) {
      this->lastFocusItem = _t1;
      GVar2 = QGraphicsItem::flags(_t1);
      if ((((uint)GVar2.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                  super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i >> 0xc & 1) != 0) &&
         (QCoreApplication::self != 0)) {
        QGuiApplication::inputMethod();
        QInputMethod::commit();
      }
      this->focusItem = (QGraphicsItem *)0x0;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QFocusEvent::QFocusEvent((QFocusEvent *)&local_58,FocusOut,focusReason);
      sendEvent(this,this->lastFocusItem,(QEvent *)&local_58);
      QFocusEvent::~QFocusEvent((QFocusEvent *)&local_58);
    }
    if (bVar1) {
LAB_005944de:
      updateInputMethodSensitivityInViews(this);
    }
    else {
      pQVar3 = (QGraphicsScene *)QGraphicsItem::scene(item);
      if (pQVar3 != this_00) goto LAB_005944de;
      this->focusItem = item;
      updateInputMethodSensitivityInViews(this);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QFocusEvent::QFocusEvent((QFocusEvent *)&local_58,FocusIn,focusReason);
      sendEvent(this,item,(QEvent *)&local_58);
      QFocusEvent::~QFocusEvent((QFocusEvent *)&local_58);
    }
    if (emitFocusChanged) {
      QGraphicsScene::focusItemChanged(this_00,this->focusItem,_t1,focusReason);
    }
  }
LAB_00594500:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_005945bb:
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::setFocusItemHelper(QGraphicsItem *item,
                                               Qt::FocusReason focusReason,
                                               bool emitFocusChanged)
{
    Q_Q(QGraphicsScene);
    if (item == focusItem)
        return;

    // Clear focus if asked to set focus on something that can't
    // accept input focus.
    if (item && (!(item->flags() & QGraphicsItem::ItemIsFocusable)
                 || !item->isVisible() || !item->isEnabled())) {
        item = nullptr;
    }

    // Set focus on the scene if an item requests focus.
    if (item) {
        q->setFocus(focusReason);
        if (item == focusItem) {
            if (emitFocusChanged)
                emit q->focusItemChanged(focusItem, (QGraphicsItem *)nullptr, focusReason);
            return;
        }
    }

    QGraphicsItem *oldFocusItem = focusItem;
    if (focusItem) {
        lastFocusItem = focusItem;

#ifndef QT_NO_IM
        if (lastFocusItem->flags() & QGraphicsItem::ItemAcceptsInputMethod) {
            // Close any external input method panel. This happens
            // automatically by removing WA_InputMethodEnabled on
            // the views, but if we are changing focus, we have to
            // do it ourselves.
            if (qApp)
                QGuiApplication::inputMethod()->commit();
        }
#endif //QT_NO_IM

        focusItem = nullptr;
        QFocusEvent event(QEvent::FocusOut, focusReason);
        sendEvent(lastFocusItem, &event);
    }

    // This handles the case that the item has been removed from the
    // scene in response to the FocusOut event.
    if (item && item->scene() != q)
        item = nullptr;

    if (item)
        focusItem = item;
    updateInputMethodSensitivityInViews();

    if (item) {
        QFocusEvent event(QEvent::FocusIn, focusReason);
        sendEvent(item, &event);
    }

    if (emitFocusChanged)
        emit q->focusItemChanged(focusItem, oldFocusItem, focusReason);
}